

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

void __thiscall
TasGrid::GridWavelet::addChild(GridWavelet *this,int *point,int direction,Data2D<int> *destination)

{
  bool bVar1;
  int L;
  int R;
  vector<int,_std::allocator<int>_> kid;
  int local_48;
  int local_44;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_40,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,(allocator_type *)&local_48);
  RuleWavelet::getChildren(&this->rule1D,point[direction],&local_48,&local_44);
  local_40._M_impl.super__Vector_impl_data._M_start[direction] = local_48;
  if (local_48 != -1) {
    bVar1 = MultiIndexSet::missing
                      (&(this->super_BaseCanonicalGrid).points,
                       (vector<int,_std::allocator<int>_> *)&local_40);
    if (bVar1) {
      Data2D<int>::appendStrip(destination,(vector<int,_std::allocator<int>_> *)&local_40);
    }
  }
  local_40._M_impl.super__Vector_impl_data._M_start[direction] = local_44;
  if (local_44 != -1) {
    bVar1 = MultiIndexSet::missing
                      (&(this->super_BaseCanonicalGrid).points,
                       (vector<int,_std::allocator<int>_> *)&local_40);
    if (bVar1) {
      Data2D<int>::appendStrip(destination,(vector<int,_std::allocator<int>_> *)&local_40);
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void GridWavelet::addChild(const int point[], int direction, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int L, R; rule1D.getChildren(point[direction], L, R);
    kid[direction] = L;
    if ((kid[direction] != -1) && points.missing(kid)){
        destination.appendStrip(kid);
    }
    kid[direction] = R;
    if ((kid[direction] != -1) && points.missing(kid)){
        destination.appendStrip(kid);
}
}